

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsl_optimizer.cpp
# Opt level: O2

void __thiscall glslopt_shader::~glslopt_shader(glslopt_shader *this)

{
  long lVar1;
  
  for (lVar1 = 0; lVar1 != 6; lVar1 = lVar1 + 1) {
    ralloc_free(this->whole_program->_LinkedShaders[lVar1]);
  }
  ralloc_free(this->whole_program);
  ralloc_free(this->rawOutput);
  ralloc_free(this->optimizedOutput);
  return;
}

Assistant:

~glslopt_shader()
	{
		for (unsigned i = 0; i < MESA_SHADER_STAGES; i++)
			ralloc_free(whole_program->_LinkedShaders[i]);
		ralloc_free(whole_program);
		ralloc_free(rawOutput);
		ralloc_free(optimizedOutput);
	}